

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

Var Js::GlobalObject::EntryTelemetryLog(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptString *infoStringJs;
  JavascriptBoolean *pJVar7;
  undefined4 extraout_var;
  PAL_FILE *stream;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x639,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)local_38 & 0xfffffe) == 0) {
LAB_00b5c55a:
    TTDAbort_unrecoverable_error("Bad arguments!!!");
  }
  pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
  bVar3 = VarIs<Js::JavascriptString>(pvVar6);
  if (!bVar3) goto LAB_00b5c55a;
  pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
  infoStringJs = VarTo<Js::JavascriptString>(pvVar6);
  if ((local_38._0_4_ & 0xffffff) == 3) {
    pvVar6 = Arguments::operator[]((Arguments *)local_38,2);
    bVar3 = VarIs<Js::JavascriptBoolean>(pvVar6);
    if (bVar3) {
      pvVar6 = Arguments::operator[]((Arguments *)local_38,2);
      pJVar7 = VarTo<Js::JavascriptBoolean>(pvVar6);
      bVar3 = pJVar7->value != 0;
      goto LAB_00b5c4a4;
    }
  }
  bVar3 = false;
LAB_00b5c4a4:
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (pSVar1->TTDShouldPerformReplayAction == true) {
    TTD::EventLog::ReplayTelemetryLogEvent(pSVar1->threadContext->TTDLog,infoStringJs);
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (pSVar1->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordTelemetryLogEvent(pSVar1->threadContext->TTDLog,infoStringJs,bVar3);
  }
  if (bVar3 != false) {
    iVar4 = (*(infoStringJs->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(infoStringJs);
    Output::Print(L"%ls\n",CONCAT44(extraout_var,iVar4));
    stream = PAL_get_stdout(0);
    PAL_fflush(stream);
  }
  return (((((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
         super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

Var GlobalObject::EntryTelemetryLog(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        TTDAssert(args.Info.Count >= 2 && Js::VarIs<Js::JavascriptString>(args[1]), "Bad arguments!!!");

        Js::JavascriptString* jsString = Js::VarTo<Js::JavascriptString>(args[1]);
        bool doPrint = (args.Info.Count == 3) && Js::VarIs<Js::JavascriptBoolean>(args[2]) && (Js::VarTo<Js::JavascriptBoolean>(args[2])->GetValue());

        if(function->GetScriptContext()->ShouldPerformReplayAction())
        {
            function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayTelemetryLogEvent(jsString);
        }

        if(function->GetScriptContext()->ShouldPerformRecordAction())
        {
            function->GetScriptContext()->GetThreadContext()->TTDLog->RecordTelemetryLogEvent(jsString, doPrint);
        }

        if(doPrint)
        {
            //
            //TODO: the host should give us a print callback which we can use here
            //
            Output::Print(_u("%ls\n"), jsString->GetSz());
            fflush(stdout);
        }

        return function->GetScriptContext()->GetLibrary()->GetUndefined();
    }